

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O1

void cmn_live_set(cmn_t *cmn,mfcc_t *vec)

{
  int iVar1;
  mfcc_t *pmVar2;
  mfcc_t *pmVar3;
  char *pcVar4;
  long lVar5;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
          ,0x38,"Update from < %s >\n",cmn->repr);
  iVar1 = cmn->veclen;
  if (0 < (long)iVar1) {
    pmVar2 = cmn->cmn_mean;
    pmVar3 = cmn->sum;
    lVar5 = 0;
    do {
      pmVar2[lVar5] = vec[lVar5];
      pmVar3[lVar5] = (mfcc_t)((float)vec[lVar5] * 500.0);
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  cmn->nframe = 500;
  pcVar4 = cmn_update_repr(cmn);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
          ,0x3e,"Update to   < %s >\n",pcVar4);
  return;
}

Assistant:

void
cmn_live_set(cmn_t *cmn, mfcc_t const * vec)
{
    int32 i;

    E_INFO("Update from < %s >\n", cmn->repr);
    for (i = 0; i < cmn->veclen; i++) {
        cmn->cmn_mean[i] = vec[i];
        cmn->sum[i] = vec[i] * CMN_WIN;
    }
    cmn->nframe = CMN_WIN;
    E_INFO("Update to   < %s >\n", cmn_update_repr(cmn));
}